

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvncclient.cpp
# Opt level: O0

void QVncClient::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 in_EDX;
  int in_ESI;
  QVncClient *in_RDI;
  QVncClient *_t;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      readClient(_t);
      break;
    case 1:
      discardClient((QVncClient *)0x116324);
      break;
    case 2:
      checkUpdate(in_RDI);
      break;
    case 3:
      scheduleUpdate(in_RDI);
    }
  }
  return;
}

Assistant:

void QVncClient::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QVncClient *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->readClient(); break;
        case 1: _t->discardClient(); break;
        case 2: _t->checkUpdate(); break;
        case 3: _t->scheduleUpdate(); break;
        default: ;
        }
    }
    (void)_a;
}